

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O3

void NULLC::TraceDump(void)

{
  long lVar1;
  OutputContext *this;
  uint uVar2;
  uint uVar3;
  char *format;
  undefined8 *puVar4;
  ulong uVar5;
  
  this = traceContext;
  if (traceContext[1].outputBufDef[0] != '\x01') goto LAB_0010eb5b;
  if (*(int *)(traceContext[1].outputBufDef + 0x30) == 0) {
    if (traceContext[1].outputBufDef[2] != '\0') goto LAB_0010eb3f;
  }
  else {
    uVar5 = 0;
    uVar3 = 0;
    do {
      lVar1 = *(long *)(this[1].outputBufDef + 0x38);
      uVar2 = *(uint *)(lVar1 + uVar5 * 8);
      if ((uVar2 & 1) == 0) {
        if ((uVar2 & 2) == 0) {
          if (this[1].outputBufDef[2] == '\x01') {
            if (uVar3 != 0) {
              OutputContext::Printf(this,"}");
            }
            uVar3 = 0;
            OutputContext::Printf(this,"},\n");
          }
          else if (this[1].outputBufDef[1] == '\x01') {
            OutputContext::Printf(this,",\n");
            this[1].outputBufDef[1] = '\0';
          }
          this[1].outputBufDef[2] = '\0';
          if (*(uint *)(this[1].outputBufDef + 8) < 0x21) {
            OutputContext::Printf
                      (this,"{\"ph\":\"E\",\"ts\":%d,\"pid\":1,\"tid\":1}",
                       (ulong)*(uint *)(lVar1 + 4 + uVar5 * 8));
            this[1].outputBufDef[1] = '\x01';
            *(int *)(this[1].outputBufDef + 8) = *(int *)(this[1].outputBufDef + 8) + -1;
          }
          else {
            *(uint *)(this[1].outputBufDef + 8) = *(uint *)(this[1].outputBufDef + 8) - 1;
          }
        }
        else if (*(uint *)(this[1].outputBufDef + 8) < 0x21) {
          format = ",";
          if (uVar3 == 0) {
            format = ",\"args\":{";
          }
          OutputContext::Printf(this,format);
          OutputContext::Printf
                    (this,"\"label %d\":\"%s\"",(ulong)uVar3,
                     (ulong)(*(uint *)(lVar1 + uVar5 * 8) >> 2) +
                     *(long *)(this[1].outputBufDef + 0x28));
          uVar3 = uVar3 + 1;
        }
      }
      else {
        puVar4 = (undefined8 *)((ulong)(uVar2 >> 2) * 0x10 + *(long *)(this[1].outputBufDef + 0x18))
        ;
        if (this[1].outputBufDef[2] == '\x01') {
          if (uVar3 != 0) {
            OutputContext::Printf(this,"}");
          }
          uVar3 = 0;
          OutputContext::Printf(this,"},\n");
        }
        else if (this[1].outputBufDef[1] == '\x01') {
          OutputContext::Printf(this,",\n");
          this[1].outputBufDef[1] = '\0';
        }
        this[1].outputBufDef[2] = '\0';
        uVar2 = *(int *)(this[1].outputBufDef + 8) + 1;
        *(uint *)(this[1].outputBufDef + 8) = uVar2;
        if (uVar2 < 0x21) {
          OutputContext::Printf
                    (this,
                     "{\"ph\":\"B\",\"ts\":%d,\"pid\":1,\"tid\":1,\"name\":\"%s\",\"cat\":\"%s\"",
                     (ulong)*(uint *)(lVar1 + 4 + uVar5 * 8),puVar4[1],*puVar4);
          this[1].outputBufDef[2] = '\x01';
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < *(uint *)(this[1].outputBufDef + 0x30));
    if (this[1].outputBufDef[2] != '\0') {
      if (uVar3 != 0) {
        OutputContext::Printf(this,"}");
      }
LAB_0010eb3f:
      OutputContext::Printf(this,"}");
      this[1].outputBufDef[1] = '\x01';
    }
  }
  this[1].outputBufDef[2] = '\0';
LAB_0010eb5b:
  this[1].outputBufDef[0x30] = '\0';
  this[1].outputBufDef[0x31] = '\0';
  this[1].outputBufDef[0x32] = '\0';
  this[1].outputBufDef[0x33] = '\0';
  this[1].outputBufDef[0x20] = '\0';
  this[1].outputBufDef[0x21] = '\0';
  this[1].outputBufDef[0x22] = '\0';
  this[1].outputBufDef[0x23] = '\0';
  return;
}

Assistant:

inline void TraceDump()
	{
		TraceContext &context = *traceContext;

		if(!context.outputEnabled)
		{
			context.events.count = 0;
			context.labels.count = 0;
			return;
		}

		unsigned currentLabel = 0;

		for(unsigned i = 0; i < context.events.count; i++)
		{
			TraceEvent &traceEvent = context.events.data[i];

			if(traceEvent.isEnter)
			{
				TraceScopeToken &token = context.scopeTokens.data[traceEvent.token];

				if(context.openEvent)
				{
					if(currentLabel != 0)
					{
						context.output.Printf("}");
						currentLabel = 0;
					}

					context.output.Printf("},\n");
				}
				else if(context.needComma)
				{
					context.output.Printf(",\n");
					context.needComma = false;
				}

				context.openEvent = false;

				context.outputDepth++;

				if(context.outputDepth > 32)
					continue;

				context.output.Printf("{\"ph\":\"B\",\"ts\":%d,\"pid\":1,\"tid\":1,\"name\":\"%s\",\"cat\":\"%s\"", traceEvent.ts, token.name, token.category);

				context.openEvent = true;
			}
			else if(traceEvent.isLabel)
			{
				if(context.outputDepth > 32)
					continue;

				if(currentLabel == 0)
					context.output.Printf(",\"args\":{");
				else
					context.output.Printf(",");

				context.output.Printf("\"label %d\":\"%s\"", currentLabel, &context.labels.data[traceEvent.token]);
				currentLabel++;
			}
			else
			{
				if(context.openEvent)
				{
					if(currentLabel != 0)
					{
						context.output.Printf("}");
						currentLabel = 0;
					}

					context.output.Printf("},\n");
				}
				else if(context.needComma)
				{
					context.output.Printf(",\n");
					context.needComma = false;
				}

				context.openEvent = false;

				if(context.outputDepth > 32)
				{
					context.outputDepth--;
					continue;
				}

				context.output.Printf("{\"ph\":\"E\",\"ts\":%d,\"pid\":1,\"tid\":1}", traceEvent.ts);

				context.needComma = true;

				context.outputDepth--;
			}
		}

		if(context.openEvent)
		{
			if(currentLabel != 0)
			{
				context.output.Printf("}");
				currentLabel = 0;
			}

			context.output.Printf("}");

			context.needComma = true;
		}

		context.openEvent = false;

		context.events.count = 0;
		context.labels.count = 0;
	}